

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

string * __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_multiline_string_abi_cxx11_
          (string *__return_storage_ptr__,parser_t<comments_skipper_t> *this)

{
  size_t sVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  uint32_t codepoint;
  parser_error_t *ppVar5;
  size_t sVar6;
  char cVar7;
  allocator local_71;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = input_stream_t::peek(&this->input);
  if ((cVar2 == '\r') || (cVar2 = input_stream_t::peek(&this->input), cVar2 == '\n')) {
    parse_new_line(this);
  }
LAB_00162802:
  while( true ) {
    while( true ) {
      while( true ) {
        cVar2 = input_stream_t::peek(&this->input);
        cVar7 = (char)__return_storage_ptr__;
        if ((cVar2 != '\r') && (cVar2 = input_stream_t::peek(&this->input), cVar2 != '\n')) break;
        parse_new_line(this);
        std::__cxx11::string::push_back(cVar7);
      }
      bVar3 = input_stream_t::get(&this->input);
      if (bVar3 < 0x20) {
        ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_50,"Control characters must be escaped",&local_71);
        sVar1 = (this->input).m_processed;
        sVar6 = 0;
        if (sVar1 != 0) {
          sVar6 = sVar1 - 1;
        }
        parser_error_t::parser_error_t(ppVar5,&local_50,sVar6);
        __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      }
      if (bVar3 == 0x5c) break;
      if ((bVar3 == 0x22) && (cVar2 = input_stream_t::peek(&this->input), cVar2 == '\"')) {
        input_stream_t::get(&this->input);
        cVar2 = input_stream_t::peek(&this->input);
        if (cVar2 == '\"') {
          input_stream_t::get(&this->input);
          return __return_storage_ptr__;
        }
        std::__cxx11::string::push_back(cVar7);
      }
      std::__cxx11::string::push_back(cVar7);
    }
    cVar2 = input_stream_t::peek(&this->input);
    if ((cVar2 != '\r') && (cVar2 = input_stream_t::peek(&this->input), cVar2 != '\n')) break;
    parse_new_line(this);
    while( true ) {
      cVar2 = input_stream_t::peek(&this->input);
      iVar4 = isspace((int)cVar2);
      if (iVar4 == 0) break;
      input_stream_t::get(&this->input);
    }
  }
  sVar1 = (this->input).m_processed;
  sVar6 = sVar1 - 1;
  if (sVar1 == 0) {
    sVar6 = 0;
  }
  cVar2 = input_stream_t::get(&this->input);
  switch(cVar2) {
  case 'n':
    break;
  case 'o':
  case 'p':
  case 'q':
  case 's':
switchD_00162923_caseD_6f:
    ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_70,"Invalid escape-sequence",&local_71);
    parser_error_t::parser_error_t(ppVar5,&local_70,sVar6);
    __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
  case 'r':
    break;
  case 't':
    break;
  case 'u':
    codepoint = parse_4_digit_codepoint(this);
LAB_00162955:
    process_codepoint(this,codepoint,sVar6,__return_storage_ptr__);
    goto LAB_00162802;
  default:
    if (cVar2 != '\"') {
      if (cVar2 == 'U') {
        codepoint = parse_8_digit_codepoint(this);
        goto LAB_00162955;
      }
      if (((cVar2 != '\\') && (cVar2 != 'f')) && (cVar2 != 'b')) goto switchD_00162923_caseD_6f;
    }
  }
  std::__cxx11::string::push_back(cVar7);
  goto LAB_00162802;
}

Assistant:

std::string parse_multiline_string() {
        std::string result;

        // Ignore first new-line after open quotes.
        if (input.peek() == '\r' || input.peek() == '\n') {
            parse_new_line();
        }

        while (true) {
            if (input.peek() == '\r' || input.peek() == '\n') {
                parse_new_line();
                result.push_back('\n');
                continue;
            }

            char ch = input.get();
            if (iscontrol(ch)) {
                throw parser_error_t("Control characters must be escaped", last_char_offset());
            } else if (ch == '"') {
                if (input.peek() == '"') {
                    input.get();
                    if (input.peek() == '"') {
                        input.get();
                        break;
                    }
                    result.push_back('"');
                }
                result.push_back('"');
            } else if (ch == '\\') {
                if (input.peek() == '\r' || input.peek() == '\n') {
                    parse_new_line();
                    while (std::isspace(input.peek())) {
                        input.get();
                    }
                    continue;
                }

                std::size_t escape_sequence_offset = last_char_offset();
                char ch = input.get();
                if (ch == 'b') {
                    result.push_back('\b');
                } else if (ch == 't') {
                    result.push_back('\t');
                } else if (ch == 'n') {
                    result.push_back('\n');
                } else if (ch == 'f') {
                    result.push_back('\f');
                } else if (ch == 'r') {
                    result.push_back('\r');
                } else if (ch == '"') {
                    result.push_back('"');
                } else if (ch == '\\') {
                    result.push_back('\\');
                } else if (ch == 'u') {
                    process_codepoint(parse_4_digit_codepoint(), escape_sequence_offset, result);
                } else if (ch == 'U') {
                    process_codepoint(parse_8_digit_codepoint(), escape_sequence_offset, result);
                } else {
                    throw parser_error_t("Invalid escape-sequence", escape_sequence_offset);
                }
            } else {
                result.push_back(ch);
            }
        }

        return result;
    }